

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::BasicReporter::StartTestCase(BasicReporter *this,TestCaseInfo *testInfo)

{
  SpanInfo SStack_38;
  
  SpanInfo::SpanInfo(&SStack_38,&testInfo->m_name);
  SpanInfo::operator=(&this->m_testSpan,&SStack_38);
  std::__cxx11::string::~string((string *)&SStack_38);
  return;
}

Assistant:

virtual void StartTestCase( const TestCaseInfo& testInfo ) {
            m_testSpan = testInfo.getName();
        }